

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

xmlNodeSetPtr xmlXPathDistinctSorted(xmlNodeSetPtr nodes)

{
  uint size;
  int iVar1;
  xmlNodeSetPtr cur;
  xmlHashTablePtr table;
  xmlChar *name;
  void *pvVar2;
  xmlNodeSetPtr pxVar3;
  xmlNodePtr node;
  ulong uVar4;
  ulong uVar5;
  
  if (nodes == (xmlNodeSetPtr)0x0) {
    pxVar3 = (xmlNodeSetPtr)0x0;
  }
  else {
    pxVar3 = nodes;
    if ((nodes->nodeNr != 0) && (nodes->nodeTab != (xmlNodePtr *)0x0)) {
      uVar4 = 0;
      cur = xmlXPathNodeSetCreate((xmlNodePtr)0x0);
      pxVar3 = (xmlNodeSetPtr)0x0;
      if (cur != (xmlNodeSetPtr)0x0) {
        size = nodes->nodeNr;
        table = xmlHashCreate(size);
        uVar5 = (ulong)size;
        if ((int)size < 1) {
          uVar5 = uVar4;
        }
        for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
          if ((long)uVar4 < (long)nodes->nodeNr) {
            node = nodes->nodeTab[uVar4];
          }
          else {
            node = (xmlNodePtr)0x0;
          }
          name = xmlXPathCastNodeToString(node);
          pvVar2 = xmlHashLookup(table,name);
          if (pvVar2 == (void *)0x0) {
            xmlHashAddEntry(table,name,name);
            iVar1 = xmlXPathNodeSetAddUnique(cur,node);
            if (iVar1 < 0) break;
          }
          else {
            (*xmlFree)(name);
          }
        }
        xmlHashFree(table,xmlHashDefaultDeallocator);
        pxVar3 = cur;
      }
    }
  }
  return pxVar3;
}

Assistant:

xmlNodeSetPtr
xmlXPathDistinctSorted (xmlNodeSetPtr nodes) {
    xmlNodeSetPtr ret;
    xmlHashTablePtr hash;
    int i, l;
    xmlChar * strval;
    xmlNodePtr cur;

    if (xmlXPathNodeSetIsEmpty(nodes))
	return(nodes);

    ret = xmlXPathNodeSetCreate(NULL);
    if (ret == NULL)
        return(ret);
    l = xmlXPathNodeSetGetLength(nodes);
    hash = xmlHashCreate (l);
    for (i = 0; i < l; i++) {
	cur = xmlXPathNodeSetItem(nodes, i);
	strval = xmlXPathCastNodeToString(cur);
	if (xmlHashLookup(hash, strval) == NULL) {
	    xmlHashAddEntry(hash, strval, strval);
            /* TODO: Propagate memory error. */
	    if (xmlXPathNodeSetAddUnique(ret, cur) < 0)
	        break;
	} else {
	    xmlFree(strval);
	}
    }
    xmlHashFree(hash, xmlHashDefaultDeallocator);
    return(ret);
}